

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilSupp.c
# Opt level: O3

void Abc_SuppVerify(Vec_Wrd_t *p,word *pMatrix,int nVars,int nVarsMin)

{
  word *pwVar1;
  bool bVar2;
  Vec_Wrd_t *p_00;
  word *__ptr;
  ulong uVar3;
  word *pwVar4;
  int iVar5;
  ulong uVar6;
  word *pwVar7;
  long lVar8;
  int iVar9;
  word Entry;
  word *pwVar10;
  bool bVar11;
  bool bVar12;
  ulong uVar13;
  
  iVar9 = p->nSize;
  p_00 = (Vec_Wrd_t *)malloc(0x10);
  iVar5 = 0x10;
  if (0xe < iVar9 - 1U) {
    iVar5 = iVar9;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar5;
  if (iVar5 == 0) {
    __ptr = (word *)0x0;
  }
  else {
    __ptr = (word *)malloc((long)iVar5 << 3);
  }
  p_00->pArray = __ptr;
  if (0 < iVar9) {
    lVar8 = 0;
    do {
      if (nVarsMin < 1) {
        Entry = 0;
      }
      else {
        uVar3 = 0;
        Entry = 0;
        do {
          if (nVars < 1) {
LAB_0041e2b0:
            uVar6 = 0;
          }
          else {
            uVar6 = 0;
            bVar2 = false;
            do {
              bVar11 = bVar2;
              uVar13 = 1L << ((byte)uVar6 & 0x3f);
              bVar12 = (uVar13 & p->pArray[lVar8]) != 0 && (pMatrix[uVar3] & uVar13) != 0;
              uVar6 = uVar6 + 1;
              bVar2 = (bool)(bVar11 ^ bVar12);
            } while ((uint)nVars != uVar6);
            uVar6 = 1L << ((byte)uVar3 & 0x3f);
            if (bVar11 == bVar12) goto LAB_0041e2b0;
          }
          Entry = Entry | uVar6;
          uVar3 = uVar3 + 1;
        } while (uVar3 != (uint)nVarsMin);
      }
      Vec_WrdPush(p_00,Entry);
      lVar8 = lVar8 + 1;
    } while (lVar8 < p->nSize);
    __ptr = p_00->pArray;
    if (0 < (long)p_00->nSize) {
      pwVar4 = __ptr + p_00->nSize;
      iVar9 = 0;
      pwVar7 = __ptr;
      do {
        pwVar1 = pwVar7 + 1;
        if (pwVar4 <= pwVar1) break;
        pwVar10 = pwVar1;
        do {
          iVar9 = iVar9 + (uint)(*pwVar7 == *pwVar10);
          pwVar10 = pwVar10 + 1;
        } while (pwVar10 < pwVar4);
        pwVar7 = pwVar1;
      } while (pwVar1 < pwVar4);
      if (iVar9 != 0) {
        printf("The total of %d pairs fail verification.\n");
        goto LAB_0041e34c;
      }
    }
  }
  puts("Verification successful.");
LAB_0041e34c:
  if (__ptr != (word *)0x0) {
    free(__ptr);
  }
  free(p_00);
  return;
}

Assistant:

void Abc_SuppVerify( Vec_Wrd_t * p, word * pMatrix, int nVars, int nVarsMin )
{
    Vec_Wrd_t * pNew;
    word * pLimit, * pEntry1, * pEntry2;
    word Entry, EntryNew;
    int i, k, v, Value, Counter = 0;
    pNew = Vec_WrdAlloc( Vec_WrdSize(p) );
    Vec_WrdForEachEntry( p, Entry, i )
    {
        EntryNew = 0;
        for ( v = 0; v < nVarsMin; v++ )
        {
            Value = 0;
            for ( k = 0; k < nVars; k++ )
                if ( ((pMatrix[v] >> k) & 1) && ((Entry >> k) & 1) )
                    Value ^= 1;
            if ( Value )
                EntryNew |= (((word)1) << v);            
        }
        Vec_WrdPush( pNew, EntryNew );
    }
    // check that they are disjoint
    pLimit  = Vec_WrdLimit(pNew);
    pEntry1 = Vec_WrdArray(pNew);
    for ( ; pEntry1 < pLimit; pEntry1++ )
    for ( pEntry2 = pEntry1 + 1; pEntry2 < pLimit; pEntry2++ )
        if ( *pEntry1 == *pEntry2 )
            Counter++;
    if ( Counter )
        printf( "The total of %d pairs fail verification.\n", Counter );
    else
        printf( "Verification successful.\n" );
    Vec_WrdFree( pNew );
}